

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *this_00;
  RegionAllocator<unsigned_int> *this_01;
  bool bVar1;
  int iVar2;
  uint uVar4;
  Lit LVar5;
  uint *puVar6;
  Clause *pCVar7;
  anon_struct_4_5_613047fb_for_header *this_02;
  vec<unsigned_int,_int> *pvVar8;
  uint *puVar9;
  int iVar10;
  int iVar11;
  Clause CVar12;
  int i;
  ulong uVar13;
  Ref r;
  undefined7 in_register_00000031;
  int iVar14;
  Queue<unsigned_int> *this_03;
  lbool local_69;
  Var best;
  int local_64;
  RegionAllocator<unsigned_int> *local_60;
  uint local_58;
  uint local_54;
  SimpSolver *local_50;
  undefined4 local_48;
  Ref local_44;
  Queue<unsigned_int> *local_40;
  vec<unsigned_int,_int> *local_38;
  int iVar3;
  
  local_48 = (undefined4)CONCAT71(in_register_00000031,verbose);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x15a,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  local_40 = &this->subsumption_queue;
  local_60 = &(this->super_Solver).ca.ra;
  this_00 = &this->occurs;
  local_58 = 0;
  local_54 = 0;
  this_03 = local_40;
  iVar14 = 0;
  local_50 = this;
  do {
    do {
      this_01 = local_60;
      iVar2 = (this->subsumption_queue).end;
      iVar3 = 0;
      iVar11 = (this->subsumption_queue).first;
      iVar10 = iVar2 - iVar11;
      if (iVar2 < iVar11) {
        iVar3 = (this->subsumption_queue).buf.sz;
      }
      iVar2 = iVar3 + iVar10;
      if ((iVar2 == 0 || SCARRY4(iVar3,iVar10) != iVar2 < 0) &&
         ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
        return true;
      }
      if ((this->super_Solver).asynch_interrupt == true) {
        Queue<unsigned_int>::clear(this_03,false);
        this->bwdsub_assigns = (this->super_Solver).trail.sz;
        return true;
      }
      if (iVar2 == 0) {
        iVar2 = this->bwdsub_assigns;
        if (iVar2 < (this->super_Solver).trail.sz) {
          this->bwdsub_assigns = iVar2 + 1;
          uVar4 = (this->super_Solver).trail.data[iVar2].x;
          puVar6 = RegionAllocator<unsigned_int>::operator[](local_60,this->bwdsub_tmpunit);
          puVar6[1] = uVar4;
          pCVar7 = (Clause *)RegionAllocator<unsigned_int>::operator[](this_01,this->bwdsub_tmpunit)
          ;
          Clause::calcAbstraction(pCVar7);
          Queue<unsigned_int>::insert(this_03,this->bwdsub_tmpunit);
        }
      }
      uVar4 = Queue<unsigned_int>::peek(this_03);
      Queue<unsigned_int>::pop(this_03);
      this_02 = (anon_struct_4_5_613047fb_for_header *)
                RegionAllocator<unsigned_int>::operator[](local_60,uVar4);
      CVar12.header = *this_02;
    } while (((uint)CVar12.header & 3) != 0);
    local_64 = iVar14;
    if ((((char)local_48 != '\0') && (1 < (this->super_Solver).verbosity)) &&
       (local_64 = iVar14 + 1, iVar14 % 1000 == 0)) {
      iVar14 = (this->subsumption_queue).end;
      iVar11 = 0;
      iVar2 = (this->subsumption_queue).first;
      if (iVar14 < iVar2) {
        iVar11 = (this->subsumption_queue).buf.sz;
      }
      printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
             (ulong)(uint)((iVar14 - iVar2) + iVar11),(ulong)local_54,(ulong)local_58);
      CVar12.header = *this_02;
    }
    local_44 = uVar4;
    if ((uint)CVar12.header < 0x40) {
      local_69 = Solver::value(&this->super_Solver,(Lit)*(int *)(this_02 + 1));
      bVar1 = lbool::operator==(&local_69,l_True);
      if (!bVar1) {
        __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                      ,0x173,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
      }
    }
    best = (int)this_02[1] >> 1;
    for (uVar13 = 1; uVar13 < (uint)*this_02 >> 5; uVar13 = uVar13 + 1) {
      pvVar8 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::
               operator[](&this_00->occs,(int)this_02[uVar13 + 1] >> 1);
      iVar14 = pvVar8->sz;
      pvVar8 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::
               operator[](&this_00->occs,best);
      if (iVar14 < pvVar8->sz) {
        best = (int)this_02[uVar13 + 1] >> 1;
      }
    }
    local_38 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::lookup(this_00,&best);
    puVar6 = local_38->data;
    iVar2 = 0;
    while ((this_03 = local_40, iVar14 = local_64, iVar2 < local_38->sz &&
           (((uint)*this_02 & 3) == 0))) {
      puVar9 = RegionAllocator<unsigned_int>::operator[](local_60,puVar6[iVar2]);
      if (((*puVar9 & 3) == 0) && (r = puVar6[iVar2], r != local_44)) {
        if (this->subsumption_lim != -1) {
          puVar9 = RegionAllocator<unsigned_int>::operator[](local_60,r);
          if (this->subsumption_lim <= (int)(*puVar9 >> 5)) goto LAB_00111997;
          r = puVar6[iVar2];
        }
        pCVar7 = (Clause *)RegionAllocator<unsigned_int>::operator[](local_60,r);
        LVar5 = Clause::subsumes((Clause *)this_02,pCVar7);
        this = local_50;
        if (LVar5.x != -1) {
          if (LVar5.x == -2) {
            local_54 = local_54 + 1;
            removeClause(local_50,puVar6[iVar2]);
          }
          else {
            bVar1 = strengthenClause(local_50,puVar6[iVar2],(Lit)(LVar5.x ^ 1));
            if (!bVar1) {
              return false;
            }
            local_58 = local_58 + 1;
            iVar2 = iVar2 - (uint)(LVar5.x >> 1 == best);
            this = local_50;
          }
        }
      }
LAB_00111997:
      iVar2 = iVar2 + 1;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}